

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderStorageBufferObjectBase::ValidateReadBuffer
          (ShaderStorageBufferObjectBase *this,int x,int y,int w,int h,vec3 *expected)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  vec3 *c0;
  vec4 *epsilon;
  int i;
  ulong uVar3;
  ShaderStorageBufferObjectBase *this_00;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  allocator_type local_71;
  undefined4 local_70;
  uint local_6c;
  ulong local_68;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> display;
  undefined1 local_48 [16];
  
  c0 = (vec3 *)CONCAT44(in_register_0000000c,w);
  iVar2 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext
            [4])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  auVar7._0_4_ = (float)(int)(float)(*(int *)(lVar6 + 8) * 0x800000 + 0x3f800000);
  auVar7._4_4_ = (float)(int)(float)(*(int *)(lVar6 + 0xc) * 0x800000 + 0x3f800000);
  auVar7._8_4_ = (float)(int)(float)(*(int *)(lVar6 + 0x10) * 0x800000 + 0x3f800000);
  auVar7._12_4_ = (float)(int)(float)(*(int *)(lVar6 + 0x14) * 0x800000 + 0x3f800000);
  local_48 = divps(_DAT_0166f110,auVar7);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&display,(long)(y * x),&local_71);
  epsilon = (vec4 *)display.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1907,0x1406,
             display.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  uVar5 = 0;
  if (0 < x) {
    uVar5 = (ulong)(uint)x;
  }
  if (y < 1) {
    y = 0;
  }
  local_70 = (undefined4)CONCAT71((uint7)(uint3)((uint)x >> 8),1);
  lVar6 = 0;
  local_6c = y;
  local_68 = (ulong)(uint)x;
  for (uVar4 = 0; uVar4 != local_6c; uVar4 = uVar4 + 1) {
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      this_00 = (ShaderStorageBufferObjectBase *)
                (display.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((int)lVar6 + (int)uVar3));
      bVar1 = ColorEqual(this_00,c0,(vec3 *)local_48,epsilon);
      if (!bVar1) {
        anon_unknown_0::Output
                  ("Color at (%d, %d) is (%f %f %f) should be (%f %f %f).\n",
                   (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper,
                   (double)*(float *)((long)&(this_00->super_SubcaseBase).super_GLWrapper.
                                             _vptr_GLWrapper + 4),
                   (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper.
                                      super_CallLogWrapper.m_gl,(double)c0->m_data[0],
                   (double)c0->m_data[1],(double)c0->m_data[2],uVar3 & 0xffffffff,(ulong)uVar4);
        local_70 = 0;
      }
    }
    lVar6 = lVar6 + local_68;
  }
  std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
            (&display.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
  return (bool)((byte)local_70 & 1);
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec3& expected)
	{
		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		std::vector<vec3> display(w * h);
		glReadPixels(x, y, w, h, GL_RGB, GL_FLOAT, &display[0]);

		bool result = true;
		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is (%f %f %f) should be (%f %f %f).\n", x + i, y + j,
						   display[j * w + i][0], display[j * w + i][1], display[j * w + i][2], expected[0],
						   expected[1], expected[2]);
					result = false;
				}
			}
		}

		return result;
	}